

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O2

TRef lj_ir_k64(jit_State *J,IROp op,uint64_t u64)

{
  int iVar1;
  IRIns *pIVar2;
  IRRef1 *pIVar3;
  uint uVar4;
  ulong uVar5;
  IRRef1 *pIVar6;
  
  iVar1 = 0x15;
  if (op == IR_KNUM) {
    iVar1 = 0xe;
  }
  pIVar2 = (J->cur).ir;
  pIVar6 = J->chain + op;
  pIVar3 = pIVar6;
  do {
    uVar5 = (ulong)*pIVar3;
    uVar4 = (uint)*pIVar3;
    if (uVar5 == 0) {
      uVar4 = (J->cur).nk - 2;
      uVar5 = (ulong)uVar4;
      if (uVar4 < J->irbotlim) {
        lj_ir_growbot(J);
        pIVar2 = (J->cur).ir;
      }
      (J->cur).nk = uVar4;
      pIVar2[uVar5 + 1] = (IRIns)u64;
      *(char *)((long)pIVar2 + uVar5 * 8 + 4) = (char)iVar1;
      *(char *)((long)pIVar2 + uVar5 * 8 + 5) = (char)op;
      pIVar2[uVar5].field_1.op12 = 0;
      *(IRRef1 *)((long)pIVar2 + uVar5 * 8 + 6) = *pIVar6;
      *pIVar6 = (ushort)uVar4;
      break;
    }
    pIVar3 = &(&pIVar2->field_0)[uVar5].prev;
  } while (pIVar2[uVar5 + 1] != (IRIns)u64);
  return iVar1 * 0x1000000 + uVar4;
}

Assistant:

TRef lj_ir_k64(jit_State *J, IROp op, uint64_t u64)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
  IRType t = op == IR_KNUM ? IRT_NUM : IRT_I64;
  for (ref = J->chain[op]; ref; ref = cir[ref].prev)
    if (ir_k64(&cir[ref])->u64 == u64)
      goto found;
  ref = ir_nextk64(J);
  ir = IR(ref);
  ir[1].tv.u64 = u64;
  ir->t.irt = t;
  ir->o = op;
  ir->op12 = 0;
  ir->prev = J->chain[op];
  J->chain[op] = (IRRef1)ref;
found:
  return TREF(ref, t);
}